

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcTestSubcase.hpp
# Opt level: O0

SubcaseBasePtr
deqp::TestSubcase::Create<gl4cts::(anonymous_namespace)::BasicNonMS<tcu::Vector<float,4>,4>>(void)

{
  BasicNonMS<tcu::Vector<float,_4>,_4> *this;
  SharedPtrStateBase *extraout_RDX;
  SharedPtr<deqp::SubcaseBase> *in_RDI;
  SubcaseBasePtr SVar1;
  
  this = (BasicNonMS<tcu::Vector<float,_4>,_4> *)operator_new(0x48);
  this->m_texture[2] = 0;
  this->m_texture[3] = 0;
  this->m_texture[4] = 0;
  this->m_texture[5] = 0;
  (this->super_ShaderImageSizeBase).super_SubcaseBase.super_GLWrapper.m_context = (Context *)0x0;
  this->m_texture[0] = 0;
  this->m_texture[1] = 0;
  (this->super_ShaderImageSizeBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper.m_log =
       (TestLog *)0x0;
  *(undefined8 *)
   &(this->super_ShaderImageSizeBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper.
    m_enableLog = 0;
  (this->super_ShaderImageSizeBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper =
       (_func_int **)0x0;
  (this->super_ShaderImageSizeBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper.m_gl =
       (Functions *)0x0;
  *(undefined8 *)(this->m_texture + 6) = 0;
  gl4cts::anon_unknown_0::BasicNonMS<tcu::Vector<float,_4>,_4>::BasicNonMS(this);
  de::SharedPtr<deqp::SubcaseBase>::SharedPtr(in_RDI,(SubcaseBase *)this);
  SVar1.m_state = extraout_RDX;
  SVar1.m_ptr = (SubcaseBase *)in_RDI;
  return SVar1;
}

Assistant:

static SubcaseBase::SubcaseBasePtr Create()
	{
		return SubcaseBase::SubcaseBasePtr(new Type());
	}